

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool __thiscall
Catch::MultipleReporters::assertionEnded(MultipleReporters *this,AssertionStats *assertionStats)

{
  pointer pPVar1;
  int iVar2;
  byte bVar3;
  pointer pPVar4;
  
  pPVar4 = (this->m_reporters).
           super__Vector_base<Catch::Ptr<Catch::IStreamingReporter>,_std::allocator<Catch::Ptr<Catch::IStreamingReporter>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar1 = (this->m_reporters).
           super__Vector_base<Catch::Ptr<Catch::IStreamingReporter>,_std::allocator<Catch::Ptr<Catch::IStreamingReporter>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pPVar4 == pPVar1) {
    bVar3 = 0;
  }
  else {
    bVar3 = 0;
    do {
      iVar2 = (*(pPVar4->m_p->super_IShared).super_NonCopyable._vptr_NonCopyable[0xb])
                        (pPVar4->m_p,assertionStats);
      bVar3 = bVar3 | (byte)iVar2;
      pPVar4 = pPVar4 + 1;
    } while (pPVar4 != pPVar1);
  }
  return (bool)(bVar3 & 1);
}

Assistant:

virtual bool assertionEnded( AssertionStats const& assertionStats ) CATCH_OVERRIDE {
        bool clearBuffer = false;
        for( Reporters::const_iterator it = m_reporters.begin(), itEnd = m_reporters.end();
                it != itEnd;
                ++it )
            clearBuffer |= (*it)->assertionEnded( assertionStats );
        return clearBuffer;
    }